

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::bootstrap::Bootstrap::bind_function(Bootstrap *this,Function_Params *params)

{
  bool bVar1;
  int iVar2;
  Boxed_Value *pBVar3;
  element_type *peVar4;
  size_t sVar5;
  arity_error *paVar6;
  Boxed_Value *__last;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar7;
  allocator<chaiscript::Boxed_Value> local_71;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_70;
  shared_ptr<chaiscript::dispatch::Bound_Function> local_58;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_48;
  undefined1 local_38 [8];
  Const_Proxy_Function f;
  Function_Params *params_local;
  
  bVar1 = Function_Params::empty(params);
  if (bVar1) {
    paVar6 = (arity_error *)__cxa_allocate_exception(0x18);
    exception::arity_error::arity_error(paVar6,0,1);
    __cxa_throw(paVar6,&exception::arity_error::typeinfo,exception::arity_error::~arity_error);
  }
  pBVar3 = Function_Params::operator[](params,0);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
            ((chaiscript *)local_38,pBVar3,(Type_Conversions_State *)0x0);
  peVar4 = std::
           __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
  iVar2 = dispatch::Proxy_Function_Base::get_arity(peVar4);
  if (iVar2 != -1) {
    peVar4 = std::
             __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    iVar2 = dispatch::Proxy_Function_Base::get_arity(peVar4);
    sVar5 = Function_Params::size(params);
    if ((long)iVar2 != sVar5 - 1) {
      paVar6 = (arity_error *)__cxa_allocate_exception(0x18);
      sVar5 = Function_Params::size(params);
      peVar4 = std::
               __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      iVar2 = dispatch::Proxy_Function_Base::get_arity(peVar4);
      exception::arity_error::arity_error(paVar6,(int)sVar5,iVar2);
      __cxa_throw(paVar6,&exception::arity_error::typeinfo,exception::arity_error::~arity_error);
    }
  }
  pBVar3 = Function_Params::begin(params);
  __last = Function_Params::end(params);
  std::allocator<chaiscript::Boxed_Value>::allocator(&local_71);
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  vector<chaiscript::Boxed_Value_const*,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&local_70,
             pBVar3 + 1,__last,&local_71);
  std::
  make_shared<chaiscript::dispatch::Bound_Function,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&local_58,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_38);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::
  shared_ptr<chaiscript::dispatch::Bound_Function,void>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const> *)&local_48,&local_58);
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,void>
            ((Boxed_Value *)this,&local_48,false);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_48);
  std::shared_ptr<chaiscript::dispatch::Bound_Function>::~shared_ptr(&local_58);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_70)
  ;
  std::allocator<chaiscript::Boxed_Value>::~allocator(&local_71);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)local_38);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value bind_function(const Function_Params &params) {
      if (params.empty()) {
        throw exception::arity_error(0, 1);
      }

      Const_Proxy_Function f = boxed_cast<Const_Proxy_Function>(params[0]);

      if (f->get_arity() != -1 && size_t(f->get_arity()) != params.size() - 1) {
        throw exception::arity_error(static_cast<int>(params.size()), f->get_arity());
      }

      return Boxed_Value(Const_Proxy_Function(
          std::make_shared<dispatch::Bound_Function>(std::move(f), std::vector<Boxed_Value>(params.begin() + 1, params.end()))));
    }